

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::CodeHolder::newLabelEntry(CodeHolder *this,LabelEntry **entryOut)

{
  ZoneAllocator *pZVar1;
  ZoneString<16UL> ZVar2;
  byte bVar3;
  size_t sVar4;
  long lVar5;
  Error EVar6;
  uint uVar7;
  int iVar8;
  Error EVar9;
  LabelEntry *pLVar10;
  ulong uVar11;
  long lVar12;
  ZoneString<16UL> *name;
  size_t sVar13;
  undefined8 *puVar14;
  LabelEntry **entryOut_00;
  Zone *zone;
  CodeHolder *this_00;
  ZoneString<16UL> *this_01;
  uint in_R8D;
  uint in_R9D;
  LabelType LStack_8c;
  size_t sStack_68;
  ulong uStack_60;
  LabelEntry **ppLStack_58;
  size_t sStack_28;
  
  *entryOut = (LabelEntry *)0x0;
  iVar8 = *(int *)&this->field_0x100;
  if (iVar8 == -1) {
    return 0xd;
  }
  this_00 = (CodeHolder *)&this->_allocator;
  EVar6 = 0;
  if (*(int *)&this->field_0x104 == iVar8) {
    EVar6 = ZoneVectorBase::_grow
                      ((ZoneVectorBase *)&this->_labelEntries,(ZoneAllocator *)this_00,8,1);
  }
  if (EVar6 != 0) {
    return EVar6;
  }
  if (*(long *)&((ZoneAllocator *)this_00)->field_0x0 == 0) {
    newLabelEntry();
    return 1;
  }
  entryOut_00 = (LabelEntry **)0x40;
  pLVar10 = (LabelEntry *)ZoneAllocator::_allocZeroed((ZoneAllocator *)this_00,0x40,&sStack_28);
  if (pLVar10 == (LabelEntry *)0x0) {
    return 1;
  }
  *(int *)&pLVar10->field_0xc = iVar8;
  pLVar10->_parentId = 0xffffffff;
  pLVar10->_offset = 0;
  uVar11 = (ulong)*(uint *)&this->field_0x100;
  if (*(uint *)&this->field_0x100 < *(uint *)&this->field_0x104) {
    *(LabelEntry **)(*(long *)&this->_labelEntries + uVar11 * 8) = pLVar10;
    *(int *)&this->field_0x100 = *(int *)&this->field_0x100 + 1;
    *entryOut = pLVar10;
    return 0;
  }
  newLabelEntry();
  zone = (Zone *)&uStack_60;
  *entryOut_00 = (LabelEntry *)0x0;
  this_01 = name;
  uStack_60 = uVar11;
  ppLStack_58 = entryOut;
  uVar7 = CodeHolder_hashNameAndGetSize((char *)name,(size_t *)zone);
  uVar11 = uStack_60;
  LStack_8c = (LabelType)in_R8D;
  if (uStack_60 == 0) {
    if (LStack_8c == kAnonymous) {
      EVar6 = newLabelEntry(this_00,entryOut_00);
      return EVar6;
    }
    return 0x11;
  }
  if (0x800 < uStack_60) {
    return 0x10;
  }
  if ((in_R8D & 0xff) - 2 < 2) {
    if (in_R9D != 0xffffffff) {
      return 0x12;
    }
LAB_00118f30:
    for (puVar14 = *(undefined8 **)
                    (*(long *)&this_00->_namedLabels +
                    (ulong)(uVar7 - (int)((ulong)*(uint *)&this_00->field_0x130 * (ulong)uVar7 >>
                                         (this_00->field_0x134 & 0x3f)) *
                                    *(int *)&this_00->field_0x128) * 8);
        puVar14 != (undefined8 *)0x0; puVar14 = (undefined8 *)*puVar14) {
      if ((*(uint *)(puVar14 + 6) == (uint)uVar11) && (*(uint *)((long)puVar14 + 0x14) == in_R9D)) {
        if (*(uint *)(puVar14 + 6) < 0xc) {
          this_01 = (ZoneString<16UL> *)((long)puVar14 + 0x34);
        }
        else {
          this_01 = (ZoneString<16UL> *)puVar14[7];
        }
        zone = (Zone *)name;
        iVar8 = bcmp(this_01,name,uVar11);
        if (iVar8 == 0) {
          return 0xf;
        }
      }
    }
    iVar8 = *(int *)&this_00->field_0x100;
    if (iVar8 == -1) {
      return 0xd;
    }
    pZVar1 = &this_00->_allocator;
    EVar6 = 0;
    if (*(int *)&this_00->field_0x104 == iVar8) {
      this_01 = (ZoneString<16UL> *)&this_00->_labelEntries;
      zone = (Zone *)pZVar1;
      EVar6 = ZoneVectorBase::_grow((ZoneVectorBase *)this_01,pZVar1,8,1);
    }
    if (EVar6 != 0) {
      return EVar6;
    }
    if (*(long *)&pZVar1->field_0x0 == 0) {
      newNamedLabelEntry();
      goto LAB_00119109;
    }
    pLVar10 = (LabelEntry *)ZoneAllocator::_allocZeroed(pZVar1,0x40,&sStack_68);
    if (pLVar10 == (LabelEntry *)0x0) {
      return 1;
    }
    *(uint *)&pLVar10->field_0x8 = uVar7;
    *(int *)&pLVar10->field_0xc = iVar8;
    pLVar10->_type = LStack_8c;
    pLVar10->_parentId = in_R9D;
    pLVar10->_offset = 0;
    this_01 = &pLVar10->_name;
    zone = &this_00->_zone;
    EVar6 = ZoneStringBase::setData((ZoneStringBase *)this_01,zone,0xb,(char *)name,uVar11);
    if (EVar6 != 0) {
      return EVar6;
    }
    if (*(uint *)&this_00->field_0x100 < *(uint *)&this_00->field_0x104) {
      *(LabelEntry **)(*(long *)&this_00->_labelEntries + (ulong)*(uint *)&this_00->field_0x100 * 8)
           = pLVar10;
      *(int *)&this_00->field_0x100 = *(int *)&this_00->field_0x100 + 1;
      ZoneHashBase::_insert((ZoneHashBase *)&this_00->_namedLabels,pZVar1,(ZoneHashNode *)pLVar10);
LAB_001190a1:
      *entryOut_00 = pLVar10;
      return 0;
    }
  }
  else {
    if ((in_R8D & 0xff) == 1) {
      if (*(uint *)&this_00->field_0x100 <= in_R9D) {
        return 0x12;
      }
      uVar7 = uVar7 ^ in_R9D;
      goto LAB_00118f30;
    }
    if ((in_R8D & 0xff) != 0) {
      return 2;
    }
    if (in_R9D != 0xffffffff) {
      return 0x12;
    }
    iVar8 = *(int *)&this_00->field_0x100;
    if (iVar8 == -1) {
      return 0xd;
    }
    pZVar1 = &this_00->_allocator;
    EVar6 = 0;
    if (*(int *)&this_00->field_0x104 == iVar8) {
      this_01 = (ZoneString<16UL> *)&this_00->_labelEntries;
      zone = (Zone *)pZVar1;
      EVar6 = ZoneVectorBase::_grow((ZoneVectorBase *)this_01,pZVar1,8,1);
    }
    if (EVar6 != 0) {
      return EVar6;
    }
    if (*(long *)&pZVar1->field_0x0 != 0) {
      pLVar10 = (LabelEntry *)ZoneAllocator::_allocZeroed(pZVar1,0x40,&sStack_68);
      if (pLVar10 == (LabelEntry *)0x0) {
        return 1;
      }
      *(int *)&pLVar10->field_0xc = iVar8;
      pLVar10->_parentId = 0xffffffff;
      pLVar10->_offset = 0;
      this_01 = &pLVar10->_name;
      zone = &this_00->_zone;
      EVar6 = ZoneStringBase::setData((ZoneStringBase *)this_01,zone,0xb,(char *)name,uVar11);
      if (EVar6 != 0) {
        return EVar6;
      }
      if (*(uint *)&this_00->field_0x100 < *(uint *)&this_00->field_0x104) {
        *(LabelEntry **)
         (*(long *)&this_00->_labelEntries + (ulong)*(uint *)&this_00->field_0x100 * 8) = pLVar10;
        *(int *)&this_00->field_0x100 = *(int *)&this_00->field_0x100 + 1;
        goto LAB_001190a1;
      }
      goto LAB_00119113;
    }
LAB_00119109:
    newNamedLabelEntry();
  }
  newNamedLabelEntry();
LAB_00119113:
  newNamedLabelEntry();
  sVar4 = *(size_t *)&((ZoneString<16UL> *)zone)->field_0x0;
  if (sVar4 == 0) {
    return 0;
  }
  if (sVar4 == 0xffffffffffffffff) {
    lVar5 = -1;
    EVar6 = 0;
    do {
      EVar9 = EVar6;
      lVar12 = lVar5;
      ZVar2 = this_01[lVar12 + 1];
      lVar5 = lVar12 + 1;
      EVar6 = EVar9 * 0x1003f + (uint)(byte)ZVar2;
    } while ((byte)ZVar2 != 0);
    *(ulong *)&((ZoneString<16UL> *)zone)->field_0x0 =
         (lVar12 + 2) - (ulong)(ZVar2 == (ZoneString<16UL>)0x0);
    return EVar9;
  }
  sVar13 = 0;
  EVar6 = 0;
  do {
    bVar3 = *(byte *)((long)&this_01->field_0x0 + sVar13);
    if (bVar3 == 0) {
      return 0x11;
    }
    EVar6 = EVar6 * 0x1003f + (uint)bVar3;
    sVar13 = sVar13 + 1;
  } while (sVar4 != sVar13);
  return EVar6;
}

Assistant:

Error CodeHolder::newLabelEntry(LabelEntry** entryOut) noexcept {
  *entryOut = nullptr;

  uint32_t labelId = _labelEntries.size();
  if (ASMJIT_UNLIKELY(labelId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManyLabels);

  ASMJIT_PROPAGATE(_labelEntries.willGrow(&_allocator));
  LabelEntry* le = _allocator.allocZeroedT<LabelEntry>();

  if (ASMJIT_UNLIKELY(!le))
    return DebugUtils::errored(kErrorOutOfMemory);

  le->_setId(labelId);
  le->_parentId = Globals::kInvalidId;
  le->_offset = 0;
  _labelEntries.appendUnsafe(le);

  *entryOut = le;
  return kErrorOk;
}